

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser_expressions.cpp
# Opt level: O0

SequenceMatchListSyntax * __thiscall
slang::parsing::Parser::parseSequenceMatchList(Parser *this,Token *closeParen)

{
  span<slang::syntax::TokenOrSyntax,_18446744073709551615UL> elements;
  Token comma_00;
  bool bVar1;
  SeparatedSyntaxList<slang::syntax::PropertyExprSyntax> *in_RSI;
  Token TVar2;
  span<slang::syntax::TokenOrSyntax,_18446744073709551615UL> list;
  Token comma;
  span<slang::syntax::TokenOrSyntax,_18446744073709551615UL> *in_stack_00000150;
  Token *in_stack_00000158;
  TokenKind in_stack_00000162;
  TokenKind in_stack_00000164;
  TokenKind in_stack_00000166;
  ParserBase *in_stack_00000168;
  Token *in_stack_00000180;
  RequireItems in_stack_00000188;
  DiagCode in_stack_00000190;
  anon_class_8_1_8991fb9c *in_stack_00000198;
  AllowEmpty in_stack_000001a0;
  undefined4 in_stack_ffffffffffffff20;
  undefined4 uVar3;
  undefined4 in_stack_ffffffffffffff24;
  undefined4 uVar4;
  undefined2 in_stack_ffffffffffffff2c;
  TokenKind in_stack_ffffffffffffff2e;
  ParserBase *in_stack_ffffffffffffff30;
  __extent_storage<18446744073709551615UL> _Var5;
  undefined1 local_58 [6];
  TokenKind kind;
  undefined4 in_stack_ffffffffffffffb0;
  undefined4 in_stack_ffffffffffffffb4;
  _func_int **local_28;
  Info *local_20;
  SequenceMatchListSyntax *local_8;
  
  kind = (TokenKind)((ulong)_local_58 >> 0x30);
  bVar1 = ParserBase::peek(in_stack_ffffffffffffff30,in_stack_ffffffffffffff2e);
  if (bVar1) {
    Token::Token((Token *)CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20));
    std::span<slang::syntax::TokenOrSyntax,_18446744073709551615UL>::span
              ((span<slang::syntax::TokenOrSyntax,_18446744073709551615UL> *)0x6b0cfb);
    _Var5._M_extent_value = (size_t)local_58;
    uVar3 = 1;
    uVar4 = 0x10001;
    ParserBase::
    parseList<&slang::syntax::SyntaxFacts::isPossibleArgument,&slang::syntax::SyntaxFacts::isEndOfParenList,slang::parsing::Parser::parseSequenceMatchList(slang::parsing::Token&)::__0>
              (in_stack_00000168,in_stack_00000166,in_stack_00000164,in_stack_00000162,
               in_stack_00000158,in_stack_00000150,in_stack_00000180,in_stack_00000188,
               in_stack_00000190,in_stack_00000198,in_stack_000001a0);
    elements._M_ptr._4_2_ = in_stack_ffffffffffffff2c;
    elements._M_ptr._0_4_ = uVar4;
    elements._M_ptr._6_2_ = in_stack_ffffffffffffff2e;
    elements._M_extent._M_extent_value = _Var5._M_extent_value;
    slang::syntax::SeparatedSyntaxList<slang::syntax::PropertyExprSyntax>::SeparatedSyntaxList
              ((SeparatedSyntaxList<slang::syntax::PropertyExprSyntax> *)
               CONCAT44(in_stack_ffffffffffffff24,uVar3),elements);
    comma_00.rawLen._0_2_ = in_stack_ffffffffffffff2c;
    comma_00.kind = (short)uVar4;
    comma_00._2_1_ = (char)((uint)uVar4 >> 0x10);
    comma_00.numFlags.raw = (char)((uint)uVar4 >> 0x18);
    comma_00.rawLen._2_2_ = in_stack_ffffffffffffff2e;
    comma_00.info = (Info *)_Var5._M_extent_value;
    local_8 = slang::syntax::SyntaxFactory::sequenceMatchList
                        ((SyntaxFactory *)CONCAT44(in_stack_ffffffffffffff24,uVar3),comma_00,in_RSI)
    ;
  }
  else {
    TVar2 = ParserBase::expect((ParserBase *)
                               CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),kind);
    local_28 = TVar2._0_8_;
    (in_RSI->super_SyntaxListBase)._vptr_SyntaxListBase = local_28;
    local_20 = TVar2.info;
    *(Info **)&(in_RSI->super_SyntaxListBase).super_SyntaxNode = local_20;
    local_8 = (SequenceMatchListSyntax *)0x0;
  }
  return local_8;
}

Assistant:

SequenceMatchListSyntax* Parser::parseSequenceMatchList(Token& closeParen) {
    if (!peek(TokenKind::Comma)) {
        closeParen = expect(TokenKind::CloseParenthesis);
        return nullptr;
    }

    Token comma;
    std::span<TokenOrSyntax> list;
    parseList<isPossibleArgument, isEndOfParenList>(TokenKind::Comma, TokenKind::CloseParenthesis,
                                                    TokenKind::Comma, comma, list, closeParen,
                                                    RequireItems::True, diag::ExpectedExpression,
                                                    [this] { return &parsePropertyExpr(0); });

    return &factory.sequenceMatchList(comma, list);
}